

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O3

void __thiscall helics::Input::registerCallback(Input *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Inputs.cpp:637:46)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Inputs.cpp:637:46)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  helics::ValueFederate::setInputNotificationCallback
            (this->fed,this,
             (function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)&local_28
            );
  if (local_18 != (code *)0x0) {
    (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Input::registerCallback()
{
    fed->setInputNotificationCallback(*this, [this](Input& /*unused*/, Time time) {
        handleCallback(time);
    });
}